

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::e_formatter<spdlog::details::scoped_padder>::format
          (e_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  char *__src;
  uint uVar4;
  ptrdiff_t _Num_1;
  ulong uVar5;
  ptrdiff_t _Num;
  size_t sVar6;
  ulong uVar7;
  scoped_padder p;
  scoped_padder local_70;
  format_int local_48;
  
  lVar1 = (msg->time).__d.__r;
  uVar5 = (lVar1 / 1000000000) * 0xfffffc18 + lVar1 / 1000000;
  scoped_padder::scoped_padder(&local_70,3,&(this->super_flag_formatter).padinfo_,dest);
  uVar4 = (uint)uVar5;
  uVar2 = uVar4 | 1;
  uVar3 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar3 = (uVar3 + 1) -
          (uint)(uVar4 < *(uint *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_32 +
                                  (ulong)uVar3 * 4));
  if (uVar3 < 3) {
    sVar6 = 3 - (ulong)uVar3;
    uVar7 = (dest->super_buffer<char>).size_ + sVar6;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar7);
    }
    if ((ulong)uVar3 != 3) {
      memcpy((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,
             "0000000000000000000",sVar6);
    }
    (dest->super_buffer<char>).size_ = uVar7;
  }
  __src = fmt::v6::format_int::format_decimal(&local_48,uVar5 & 0xffffffff);
  sVar6 = (long)(local_48.buffer_ + 0x15) - (long)__src;
  uVar5 = (dest->super_buffer<char>).size_ + sVar6;
  local_48.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar5);
  }
  if (local_48.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar6);
  }
  (dest->super_buffer<char>).size_ = uVar5;
  scoped_padder::~scoped_padder(&local_70);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        const size_t field_size = 3;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
    }